

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O1

void aom_smooth_h_predictor_16x64_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  short sVar15;
  short sVar17;
  undefined1 auVar16 [16];
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  undefined1 auVar36 [16];
  ushort uVar49;
  ushort uVar50;
  
  auVar16 = pshuflw(ZEXT116(top_row[0xf]),ZEXT116(top_row[0xf]),0);
  sVar15 = auVar16._0_2_;
  sVar17 = auVar16._2_2_;
  uVar12 = 0;
  do {
    uVar1 = *(ulong *)(left_column + uVar12);
    auVar2._8_6_ = 0;
    auVar2._0_8_ = uVar1;
    auVar2[0xe] = (char)(uVar1 >> 0x38);
    auVar3._8_4_ = 0;
    auVar3._0_8_ = uVar1;
    auVar3[0xc] = (char)(uVar1 >> 0x30);
    auVar3._13_2_ = auVar2._13_2_;
    auVar4._8_4_ = 0;
    auVar4._0_8_ = uVar1;
    auVar4._12_3_ = auVar3._12_3_;
    auVar5._8_2_ = 0;
    auVar5._0_8_ = uVar1;
    auVar5[10] = (char)(uVar1 >> 0x28);
    auVar5._11_4_ = auVar4._11_4_;
    auVar6._8_2_ = 0;
    auVar6._0_8_ = uVar1;
    auVar6._10_5_ = auVar5._10_5_;
    auVar7[8] = (char)(uVar1 >> 0x20);
    auVar7._0_8_ = uVar1;
    auVar7._9_6_ = auVar6._9_6_;
    auVar9._7_8_ = 0;
    auVar9._0_7_ = auVar7._8_7_;
    auVar10._1_8_ = SUB158(auVar9 << 0x40,7);
    auVar10[0] = (char)(uVar1 >> 0x18);
    auVar10._9_6_ = 0;
    auVar11._1_10_ = SUB1510(auVar10 << 0x30,5);
    auVar11[0] = (char)(uVar1 >> 0x10);
    auVar11._11_4_ = 0;
    auVar8[2] = (char)(uVar1 >> 8);
    auVar8._0_2_ = (ushort)uVar1;
    auVar8._3_12_ = SUB1512(auVar11 << 0x20,3);
    auVar16._0_2_ = (ushort)uVar1 & 0xff;
    auVar16._2_13_ = auVar8._2_13_;
    auVar16[0xf] = 0;
    uVar13 = 0xfefdfefe;
    do {
      uVar13 = uVar13 + 0x2020202;
      auVar36._4_4_ = uVar13;
      auVar36._0_4_ = uVar13;
      auVar36._8_4_ = uVar13;
      auVar36._12_4_ = uVar13;
      auVar36 = pshufb(auVar16,auVar36);
      uVar18 = auVar36._0_2_ * 0xff + sVar15 + 0x80;
      uVar20 = auVar36._2_2_ * 0xe1 + sVar17 * 0x1f + 0x80;
      uVar22 = auVar36._4_2_ * 0xc4 + sVar15 * 0x3c + 0x80;
      uVar24 = auVar36._6_2_ * 0xaa + sVar17 * 0x56 + 0x80;
      uVar26 = auVar36._8_2_ * 0x91 + sVar15 * 0x6f + 0x80;
      uVar28 = auVar36._10_2_ * 0x7b + sVar17 * 0x85 + 0x80;
      uVar30 = auVar36._12_2_ * 0x66 + sVar15 * 0x9a + 0x80;
      uVar32 = auVar36._14_2_ * 0x54 + sVar17 * 0xac + 0x80;
      uVar34 = auVar36._0_2_ * 0x44 + sVar15 * 0xbc + 0x80;
      uVar37 = auVar36._2_2_ * 0x36 + sVar17 * 0xca + 0x80;
      uVar39 = auVar36._4_2_ * 0x2b + sVar15 * 0xd5 + 0x80;
      uVar41 = auVar36._6_2_ * 0x21 + sVar17 * 0xdf + 0x80;
      uVar43 = auVar36._8_2_ * 0x1a + sVar15 * 0xe6 + 0x80;
      uVar45 = auVar36._10_2_ * 0x14 + sVar17 * 0xec + 0x80;
      uVar47 = auVar36._12_2_ * 0x11 + sVar15 * 0xef + 0x80;
      uVar49 = auVar36._14_2_ * 0x10 + sVar17 * 0xf0 + 0x80;
      uVar19 = uVar18 >> 8;
      uVar21 = uVar20 >> 8;
      uVar23 = uVar22 >> 8;
      uVar25 = uVar24 >> 8;
      uVar27 = uVar26 >> 8;
      uVar29 = uVar28 >> 8;
      uVar31 = uVar30 >> 8;
      uVar33 = uVar32 >> 8;
      uVar35 = uVar34 >> 8;
      uVar38 = uVar37 >> 8;
      uVar40 = uVar39 >> 8;
      uVar42 = uVar41 >> 8;
      uVar44 = uVar43 >> 8;
      uVar46 = uVar45 >> 8;
      uVar48 = uVar47 >> 8;
      uVar50 = uVar49 >> 8;
      *dst = (uVar19 != 0) * (uVar19 < 0x100) * (char)(uVar18 >> 8) - (0xff < uVar19);
      dst[1] = (uVar21 != 0) * (uVar21 < 0x100) * (char)(uVar20 >> 8) - (0xff < uVar21);
      dst[2] = (uVar23 != 0) * (uVar23 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar23);
      dst[3] = (uVar25 != 0) * (uVar25 < 0x100) * (char)(uVar24 >> 8) - (0xff < uVar25);
      dst[4] = (uVar27 != 0) * (uVar27 < 0x100) * (char)(uVar26 >> 8) - (0xff < uVar27);
      dst[5] = (uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8) - (0xff < uVar29);
      dst[6] = (uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) - (0xff < uVar31);
      dst[7] = (uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) - (0xff < uVar33);
      dst[8] = (uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) - (0xff < uVar35);
      dst[9] = (uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) - (0xff < uVar38);
      dst[10] = (uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40);
      dst[0xb] = (uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar42);
      dst[0xc] = (uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar44);
      dst[0xd] = (uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) - (0xff < uVar46);
      dst[0xe] = (uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48);
      dst[0xf] = (uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50);
      dst = dst + stride;
    } while (uVar13 < 0xd0c0d0d);
    bVar14 = uVar12 < 0x38;
    uVar12 = uVar12 + 8;
  } while (bVar14);
  return;
}

Assistant:

void aom_smooth_h_predictor_16x64_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[15]);
  const __m128i weights = LoadUnaligned16(smooth_weights + 12);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i weights1 = cvtepu8_epi16(weights);
  const __m128i weights2 = cvtepu8_epi16(_mm_srli_si128(weights, 8));
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i scaled_top_right1 =
      _mm_mullo_epi16(inverted_weights1, top_right);
  const __m128i scaled_top_right2 =
      _mm_mullo_epi16(inverted_weights2, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int left_offset = 0; left_offset < 64; left_offset += 8) {
    const __m128i left = cvtepu8_epi16(LoadLo8(left_column + left_offset));
    for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
      const __m128i y_select = _mm_set1_epi32(y_mask);
      const __m128i left_y = _mm_shuffle_epi8(left, y_select);
      write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                     scaled_top_right1, scaled_top_right2,
                                     round);
      dst += stride;
    }
  }
}